

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  int local_3c;
  int j;
  char vc;
  long lStack_30;
  int c;
  size_t text_index;
  uint8_t decoded [3];
  ptls_buffer_t *ppStack_20;
  int ret;
  ptls_buffer_t *buf_local;
  ptls_base64_decode_state_t *state_local;
  char *text_local;
  
  text_index._4_4_ = 0;
  for (lStack_30 = 0;
      (ppStack_20 = buf, text[lStack_30] != '\0' &&
      ((((cVar1 = text[lStack_30], cVar1 == ' ' || (cVar1 == '\t')) || (cVar1 == '\r')) ||
       (cVar1 == '\n')))); lStack_30 = lStack_30 + 1) {
  }
  do {
    bVar4 = false;
    if ((text[lStack_30] != '\0') && (bVar4 = false, text_index._4_4_ == 0)) {
      bVar4 = state->status == 1;
    }
    if (!bVar4) {
      return text_index._4_4_;
    }
    lVar3 = lStack_30 + 1;
    iVar2 = (int)text[lStack_30];
    if ((iVar2 < 1) || (0x7e < iVar2)) {
      cVar1 = -1;
    }
    else {
      cVar1 = ptls_base64_values[iVar2];
    }
    if (cVar1 == -1) {
      if (((state->nbc == 2) && (iVar2 == 0x3d)) && (text[lVar3] == '=')) {
        state->nbc = 4;
        state->nbo = 1;
        state->v = state->v << 0xc;
        lStack_30 = lStack_30 + 2;
      }
      else if ((state->nbc == 3) && (iVar2 == 0x3d)) {
        state->nbc = 4;
        state->nbo = 2;
        state->v = state->v << 6;
        lStack_30 = lVar3;
      }
      else {
        for (; (text[lStack_30] != '\0' &&
               (((cVar1 = text[lStack_30], cVar1 == ' ' || (cVar1 == '\t')) ||
                ((cVar1 == '\r' || (((cVar1 == '\n' || (cVar1 == '\v')) || (cVar1 == '\f'))))))));
            lStack_30 = lStack_30 + 1) {
        }
        if (text[lStack_30] == '\0') {
          return text_index._4_4_;
        }
        state->nbo = 0;
        state->status = -1;
        text_index._4_4_ = 0x232;
      }
    }
    else {
      state->nbc = state->nbc + 1;
      state->v = state->v << 6;
      state->v = (int)cVar1 | state->v;
      lStack_30 = lVar3;
    }
    if ((text_index._4_4_ == 0) && (state->nbc == 4)) {
      for (local_3c = 0; local_3c < state->nbo; local_3c = local_3c + 1) {
        *(char *)((long)&text_index + (long)local_3c + 1) =
             (char)(state->v >> (('\x02' - (char)local_3c) * '\b' & 0x1fU));
      }
      text_index._4_4_ =
           ptls_buffer__do_pushv(ppStack_20,(void *)((long)&text_index + 1),(long)state->nbo);
      if (text_index._4_4_ == 0) {
        if (state->nbo < 3) {
          for (; text[lStack_30] != '\0'; lStack_30 = lStack_30 + 1) {
          }
          if (text[lStack_30] == '\0') {
            state->status = 0;
            text_index._4_4_ = 0;
          }
          else {
            state->status = -1;
            text_index._4_4_ = 0x232;
          }
          return text_index._4_4_;
        }
        state->v = 0;
        state->nbo = 3;
        state->nbc = 0;
      }
    }
  } while( true );
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}